

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  string_type local_98;
  undefined4 local_74;
  long local_70;
  size_type pos;
  path local_58;
  undefined1 local_38 [8];
  impl_string_type fn;
  path *this_local;
  
  fn.field_2._8_8_ = this;
  filename(&local_58,this);
  string_abi_cxx11_((string *)local_38,&local_58);
  ~path(&local_58);
  local_70 = std::__cxx11::string::find_last_of((char)local_38,0x2e);
  if ((local_70 == -1) || (local_70 == 0)) {
    path<char[1],ghc::filesystem::path>(__return_storage_ptr__,(char (*) [1])0x228cc2,auto_format);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_98,(ulong)local_38);
    path(__return_storage_ptr__,&local_98,auto_format);
    std::__cxx11::string::~string((string *)&local_98);
  }
  local_74 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::extension() const
{
    impl_string_type fn = filename().string();
    impl_string_type::size_type pos = fn.find_last_of('.');
    if (pos == std::string::npos || pos == 0) {
        return "";
    }
    return fn.substr(pos);
}